

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O3

void Diligent::ValidateTextureDesc(TextureDesc *Desc,IRenderDevice *pDevice)

{
  Uint32 *pUVar1;
  anon_union_4_2_715f406a_for_TextureDesc_4 *Args_4;
  byte bVar2;
  TEXTURE_FORMAT Format;
  char *pcVar3;
  RESOURCE_DIMENSION RVar4;
  CPU_ACCESS_FLAGS CVar5;
  USAGE UVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  TextureFormatAttribs *pTVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char (*Args_1) [216];
  uint uVar12;
  BIND_FLAGS BVar13;
  char (*in_stack_ffffffffffffff78) [3];
  string msg;
  uint local_5c;
  uint local_58 [4];
  char *FmtName;
  long local_40;
  char *local_38;
  long lVar11;
  
  pTVar10 = GetTextureFormatAttribs(Desc->Format);
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x19])(pDevice);
  local_40 = CONCAT44(extraout_var,iVar7);
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
  RVar4 = Desc->Type;
  if (RVar4 == RESOURCE_DIM_UNDEFINED) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[10],char_const*,char[4],char[33]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x39,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [33])"Resource dimension is undefined.");
    RVar4 = Desc->Type;
  }
  if (6 < (byte)(RVar4 - RESOURCE_DIM_TEX_1D)) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[10],char_const*,char[4],char[31]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x3e,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [31])"Unexpected resource dimension.");
  }
  if (Desc->Width == 0) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[10],char_const*,char[4],char[30]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x43,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [30])"Texture width cannot be zero.");
  }
  pUVar1 = &Desc->Height;
  if ((Desc->Type & ~RESOURCE_DIM_BUFFER) == RESOURCE_DIM_TEX_1D) {
    bVar2 = pTVar10->BlockHeight;
    if (Desc->Height != (uint)bVar2) {
      if (bVar2 == 1) {
        pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar3 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar3;
        }
        LogError<true,char[10],char_const*,char[4],char[9],unsigned_int,char[46]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x4d,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [9])"Height (",pUVar1,
                   (char (*) [46])") of a Texture 1D/Texture 1D Array must be 1.");
      }
      else {
        pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar3 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar3;
        }
        FmtName = (char *)CONCAT44(FmtName._4_4_,(uint)bVar2);
        LogError<true,char[10],char_const*,char[4],char[43],unsigned_int,char[82],unsigned_int,char[3]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x53,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [43])"For block-compressed formats, the height (",pUVar1,
                   (char (*) [82])
                   ") of a Texture 1D/Texture 1D Array must be equal to the compressed block height ("
                   ,(uint *)&FmtName,(char (*) [3])0x91fe20);
      }
    }
  }
  else if (Desc->Height == 0) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[10],char_const*,char[4],char[31]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x5a,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [31])"Texture height cannot be zero.");
  }
  RVar4 = Desc->Type;
  if ((RVar4 == RESOURCE_DIM_TEX_3D) && ((Desc->field_3).ArraySize == 0)) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[10],char_const*,char[4],char[33]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x5f,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [33])"3D texture depth cannot be zero.");
    RVar4 = Desc->Type;
  }
  Args_4 = &Desc->field_3;
  if (((RVar4 == RESOURCE_DIM_TEX_2D) || (RVar4 == RESOURCE_DIM_TEX_1D)) && (Args_4->ArraySize != 1)
     ) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[10],char_const*,char[4],char[42],unsigned_int,char[69]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x65,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [42])"Texture 1D/2D must have one array slice (",&Args_4->ArraySize,
               (char (*) [69])" provided). Use Texture 1D/2D array if you need more than one slice."
              );
    RVar4 = Desc->Type;
  }
  if ((byte)(RVar4 - RESOURCE_DIM_TEX_CUBE) < 2) {
    if (Desc->Width != Desc->Height) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[39],unsigned_int,char[39],unsigned_int,char[12]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x6b,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [39])"For cube map textures, texture width (",&Desc->Width,
                 (char (*) [39])" provided) must match texture height (",pUVar1,
                 (char (*) [12])" provided).");
    }
    if (Args_4->ArraySize < 6) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[54],unsigned_int,char[12]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x6e,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [54])"Texture cube/cube array must have at least 6 slices (",
                 &Args_4->ArraySize,(char (*) [12])" provided).");
    }
    RVar4 = Desc->Type;
  }
  if ((RVar4 & ~RESOURCE_DIM_BUFFER) == RESOURCE_DIM_TEX_1D) {
    uVar9 = Desc->Width;
  }
  else {
    uVar9 = 0;
    if (RVar4 < RESOURCE_DIM_NUM_DIMENSIONS) {
      if ((0x1b0U >> (RVar4 & 0x1f) & 1) == 0) {
        if (RVar4 == 6) {
          uVar9 = Desc->Height;
          if (Desc->Height < Desc->Width) {
            uVar9 = Desc->Width;
          }
          if (uVar9 <= (Desc->field_3).ArraySize) {
            uVar9 = (Desc->field_3).ArraySize;
          }
        }
      }
      else {
        uVar9 = Desc->Height;
        if (Desc->Height < Desc->Width) {
          uVar9 = Desc->Width;
        }
      }
    }
  }
  pUVar1 = &Desc->MipLevels;
  if (uVar9 >> ((char)Desc->MipLevels - 1U & 0x1f) == 0) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    FmtName = "";
    if (pcVar3 != (char *)0x0) {
      FmtName = pcVar3;
    }
    FormatString<char[10],char_const*,char[36],unsigned_int,char[3]>
              (&msg,(Diligent *)0x90723f,(char (*) [10])&FmtName,
               (char **)"\': Incorrect number of Mip levels (",(char (*) [36])pUVar1,
               (uint *)0x91fe20,in_stack_ffffffffffffff78);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x7a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  uVar9 = Desc->SampleCount;
  if (1 < uVar9) {
    if ((uVar9 & uVar9 - 1) != 0) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[41]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x80,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [41])"SampleCount must be a power-of-two value");
    }
    if ((Desc->Type & ~RESOURCE_DIM_BUFFER) != RESOURCE_DIM_TEX_2D) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[53]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x83,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [53])"Only Texture 2D/Texture 2D Array can be multisampled");
    }
    if (*pUVar1 != 1) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[48],unsigned_int,char[20]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x86,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [48])"Multisampled textures must have one mip level (",pUVar1,
                 (char (*) [20])" levels specified).");
    }
    if ((Desc->BindFlags & BIND_UNORDERED_ACCESS) != BIND_NONE) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[48]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x89,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [48])"UAVs are not allowed for multisampled resources");
    }
  }
  if ((Desc->BindFlags & BIND_RENDER_TARGET) != BIND_NONE) {
    Format = Desc->Format;
    if (((ulong)Format < 0x40) &&
       (Args_1 = (char (*) [216])0x8408002080002000,
       (0x8408002080002000U >> ((ulong)Format & 0x3f) & 1) != 0)) {
      pTVar10 = GetTextureFormatAttribs(Format);
      FmtName = pTVar10->Name;
      FormatString<char_const*,char[216]>
                (&msg,(Diligent *)&FmtName,
                 (char **)
                 " texture is created with BIND_RENDER_TARGET flag set.\nThere might be an issue in OpenGL driver on NVidia hardware: when rendering to SNORM textures, all negative values are clamped to zero.\nUse UNORM format instead."
                 ,Args_1);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((Desc->MiscFlags & MISC_TEXTURE_FLAG_MEMORYLESS) != MISC_TEXTURE_FLAG_NONE) {
    uVar9 = *(uint *)(local_40 + 0xb4);
    if (uVar9 == 0) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[48]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x9b,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [48])"Memoryless textures are not supported by device");
      uVar9 = *(uint *)(local_40 + 0xb4);
    }
    if ((Desc->BindFlags & ~uVar9) != BIND_NONE) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      FmtName = "";
      if (pcVar3 != (char *)0x0) {
        FmtName = pcVar3;
      }
      GetBindFlagsString_abi_cxx11_
                (&msg,(Diligent *)(ulong)(Desc->BindFlags & ~uVar9),0x8946a9,pcVar3);
      LogError<true,char[10],char_const*,char[4],char[11],std::__cxx11::string,char[44]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x9e,(char (*) [10])0x90723f,&FmtName,(char (*) [4])"\': ",
                 (char (*) [11])"BindFlags ",&msg,
                 (char (*) [44])" are not supported for memoryless textures.");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if (Desc->Usage != USAGE_DEFAULT) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[46]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xa1,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [46])"Memoryless attachment requires USAGE_DEFAULT.");
    }
    if (Desc->CPUAccessFlags != CPU_ACCESS_NONE) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[58]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xa4,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [58])"Memoryless attachment requires CPUAccessFlags to be NONE.");
    }
    if ((Desc->MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS) != MISC_TEXTURE_FLAG_NONE) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[64]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xa7,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [64])"Memoryless attachment is not compatible with mipmap generation.");
    }
  }
  UVar6 = Desc->Usage;
  if (UVar6 == USAGE_UNIFIED) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[10],char_const*,char[4],char[52]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0xba,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [52])"USAGE_UNIFIED textures are currently not supported.");
  }
  else {
    if (UVar6 != USAGE_STAGING) goto LAB_006ee8f6;
    if (Desc->BindFlags != BIND_NONE) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[60]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xad,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [60])"Staging textures cannot be bound to any GPU pipeline stage.");
    }
    if ((Desc->MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS) != MISC_TEXTURE_FLAG_NONE) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[54]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xb0,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [54])"Mipmaps cannot be autogenerated for staging textures.");
    }
    CVar5 = Desc->CPUAccessFlags;
    if (CVar5 == CPU_ACCESS_NONE) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[48]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xb3,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [48])"Staging textures must specify CPU access flags.");
      CVar5 = Desc->CPUAccessFlags;
    }
    if ((~CVar5 & 3) == 0) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[76]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xb6,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [76])
                 "Staging textures must use exactly one of ACCESS_READ or ACCESS_WRITE flags.");
    }
  }
  UVar6 = Desc->Usage;
LAB_006ee8f6:
  if ((UVar6 == USAGE_DYNAMIC) &&
     ((Desc->ImmediateContextMask & Desc->ImmediateContextMask - 1) != 0)) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[10],char_const*,char[4],char[73]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0xc2,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [73])
               "USAGE_DYNAMIC textures may only be used in one immediate device context.");
  }
  iVar8 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
  lVar11 = CONCAT44(extraout_var_01,iVar8);
  if ((Desc->MiscFlags & MISC_TEXTURE_FLAG_SUBSAMPLED) != MISC_TEXTURE_FLAG_NONE) {
    iVar8 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
    if (*(char *)(CONCAT44(extraout_var_02,iVar8) + 0x33) == '\0') {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[67]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xc9,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [67])"MISC_TEXTURE_FLAG_SUBSAMPLED requires VariableRateShading feature."
                );
    }
    iVar8 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
    if (*(int *)CONCAT44(extraout_var_03,iVar8) == 6) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[111]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xcc,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [111])
                 "MISC_TEXTURE_FLAG_SUBSAMPLED is not supported in Metal, use IRasterizationRateMapMtl to implement VRS in Metal"
                );
    }
    if ((*(byte *)(lVar11 + 0x155) & 0x10) == 0) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[97]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xcf,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [97])
                 "MISC_TEXTURE_FLAG_SUBSAMPLED requires SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET capability."
                );
    }
    BVar13 = Desc->BindFlags;
    if ((BVar13 & (BIND_DEPTH_STENCIL|BIND_RENDER_TARGET)) == BIND_NONE) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[87]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xd2,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [87])
                 "Subsampled texture must use one of BIND_RENDER_TARGET or BIND_DEPTH_STENCIL bind flags"
                );
      BVar13 = Desc->BindFlags;
    }
    if ((BVar13 >> 0xb & 1) != 0) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[70]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xd5,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [70])
                 "MISC_TEXTURE_FLAG_SUBSAMPLED is not compatible with BIND_SHADING_RATE");
    }
  }
  if ((Desc->BindFlags & BIND_FLAG_LAST) != BIND_NONE) {
    iVar8 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
    if (*(char *)(CONCAT44(extraout_var_04,iVar8) + 0x33) == '\0') {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[56]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xdb,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [56])"BIND_SHADING_RATE requires VariableRateShading feature.");
    }
    iVar8 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
    if (*(int *)CONCAT44(extraout_var_05,iVar8) == 6) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[83]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xde,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [83])
                 "BIND_SHADING_RATE is not supported in Metal, use IRasterizationRateMapMtl instead."
                );
    }
    if (*(int *)CONCAT44(extraout_var_00,iVar7) == 6) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[88]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xe1,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [88])
                 "BIND_FLAG_SHADING_RATE is not supported in Metal, use IRasterizationRateMapMtl instead."
                );
    }
    if ((*(byte *)(lVar11 + 0x154) & 4) == 0) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[75]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xe4,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [75])
                 "BIND_SHADING_RATE requires SHADING_RATE_CAP_FLAG_TEXTURE_BASED capability.");
    }
    if (Desc->SampleCount != 1) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[58]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xe7,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [58])"BIND_SHADING_RATE is not allowed for multisample texture.");
    }
    if (((Desc->Type == RESOURCE_DIM_TEX_2D_ARRAY) && (1 < (Desc->field_3).ArraySize)) &&
       ((*(byte *)(lVar11 + 0x155) & 1) == 0)) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[83]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xea,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [83])
                 "Shading rate texture arrays require SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability"
                );
    }
    if (USAGE_DEFAULT < Desc->Usage) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[67]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xed,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [67])"Shading rate textures only allow USAGE_DEFAULT or USAGE_IMMUTABLE."
                );
    }
    if (*pUVar1 != 1) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[44]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xf1,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [44])"Shading rate texture must have 1 mip level.");
    }
    BVar13 = ~*(uint *)(lVar11 + 0x15c) & Desc->BindFlags;
    if (BVar13 != BIND_NONE) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      FmtName = "";
      if (pcVar3 != (char *)0x0) {
        FmtName = pcVar3;
      }
      GetBindFlagsString_abi_cxx11_(&msg,(Diligent *)(ulong)BVar13,0x91f0a4,FmtName);
      local_38 = (char *)CONCAT71(local_38._1_7_,0x2e);
      LogError<true,char[10],char_const*,char[4],char[70],std::__cxx11::string,char>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xf4,(char (*) [10])0x90723f,&FmtName,(char (*) [4])"\': ",
                 (char (*) [70])
                 "the following bind flags are not allowed for a shading rate texture: ",&msg,
                 (char *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if ((Desc->Type != RESOURCE_DIM_TEX_2D) &&
       ((Desc->Type != RESOURCE_DIM_TEX_2D_ARRAY || ((*(byte *)(lVar11 + 0x155) & 1) == 0)))) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[97]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xf8,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [97])
                 "Shading rate texture must be 2D or 2D Array with SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability."
                );
    }
    if (*(char *)(lVar11 + 0x157) == '\x02') {
      if (Desc->Format != TEX_FORMAT_RG8_UNORM) {
        pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar3 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar3;
        }
        LogError<true,char[10],char_const*,char[4],char[47]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x103,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [47])"Shading rate texture format must be RG8_UNORM.");
      }
    }
    else if (*(char *)(lVar11 + 0x157) == '\x01') {
      if (Desc->Format != TEX_FORMAT_R8_UINT) {
        pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar3 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar3;
        }
        LogError<true,char[10],char_const*,char[4],char[45]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0xfe,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [45])"Shading rate texture format must be R8_UINT.");
      }
    }
    else {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[39]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x108,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [39])"Shading rate texture is not supported.");
    }
  }
  if (Desc->Usage == USAGE_SPARSE) {
    if ((char)((int *)CONCAT44(extraout_var_00,iVar7))[0xd] == '\0') {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[48]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x10e,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [48])"sparse texture requires SparseResources feature");
    }
    if (((Desc->MiscFlags & MISC_TEXTURE_FLAG_SPARSE_ALIASING) != MISC_TEXTURE_FLAG_NONE) &&
       ((*(byte *)(local_40 + 0x1b1) & 1) == 0)) {
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[92]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x113,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [92])
                 "MISC_TEXTURE_FLAG_SPARSE_ALIASING flag requires SPARSE_RESOURCE_CAP_FLAG_ALIASED capability"
                );
    }
    switch(Desc->Type) {
    case RESOURCE_DIM_TEX_1D:
    case RESOURCE_DIM_TEX_1D_ARRAY:
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[37]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x136,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [37])"Sparse 1D textures are not supported");
      break;
    case RESOURCE_DIM_TEX_2D:
      if ((*(byte *)(local_40 + 0x1b0) & 4) == 0) {
        pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar3 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar3;
        }
        LogError<true,char[10],char_const*,char[4],char[67]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x11a,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [67])
                   "2D texture requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability");
      }
      break;
    case RESOURCE_DIM_TEX_2D_ARRAY:
    case RESOURCE_DIM_TEX_CUBE:
    case RESOURCE_DIM_TEX_CUBE_ARRAY:
      uVar9 = *(uint *)(local_40 + 0x1b0);
      if ((uVar9 & 4) == 0) {
        pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar3 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar3;
        }
        LogError<true,char[10],char_const*,char[4],char[89]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x121,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [89])
                   "2D array or Cube sparse textures requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability"
                  );
        uVar9 = *(uint *)(local_40 + 0x1b0);
      }
      if ((uVar9 >> 0xe & 1) == 0) {
        GetStandardSparseTextureProperties((SparseTextureProperties *)&msg,Desc);
        bVar2 = (byte)Desc->MipLevels;
        uVar12 = Desc->Width >> (bVar2 & 0x1f);
        uVar12 = uVar12 + (uVar12 == 0);
        uVar9 = Desc->Height >> (bVar2 & 0x1f);
        uVar9 = uVar9 + (uVar9 == 0);
        FmtName = (char *)CONCAT44(uVar9,uVar12);
        if ((uVar12 < local_5c) || (uVar9 < local_58[0])) {
          pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
          local_38 = "";
          if (pcVar3 != (char *)0x0) {
            local_38 = pcVar3;
          }
          LogError<true,char[10],char_const*,char[4],char[54],unsigned_int,char[38],unsigned_int,char[2],unsigned_int,char[31],unsigned_int,char[2],unsigned_int,char[73]>
                    (false,"ValidateTextureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                     ,299,(char (*) [10])0x90723f,&local_38,(char (*) [4])"\': ",
                     (char (*) [54])"2D array or Cube sparse texture with mip level count ",pUVar1,
                     (char (*) [38])", where the last mip with dimension (",(uint *)&FmtName,
                     (char (*) [2])0x91ed00,(uint *)((long)&FmtName + 4),
                     (char (*) [31])") is less than the tile size (",&local_5c,
                     (char (*) [2])0x91ed00,local_58,
                     (char (*) [73])
                     ") requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL capability");
        }
      }
      break;
    case RESOURCE_DIM_TEX_3D:
      if ((*(byte *)(local_40 + 0x1b0) & 8) == 0) {
        pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar3 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar3;
        }
        LogError<true,char[10],char_const*,char[4],char[74]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x131,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [74])
                   "3D sparse texture requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D capability");
      }
      break;
    default:
      pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar3 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar3;
      }
      LogError<true,char[10],char_const*,char[4],char[21]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x13a,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [21])"unknown texture type");
    }
  }
  else if ((Desc->MiscFlags & MISC_TEXTURE_FLAG_SPARSE_ALIASING) != MISC_TEXTURE_FLAG_NONE) {
    pcVar3 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar3;
    }
    LogError<true,char[10],char_const*,char[4],char[87]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x140,(char (*) [10])0x90723f,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [87])
               "MiscFlags must not have MISC_TEXTURE_FLAG_SPARSE_ALIASING if usage is not USAGE_SPARSE"
              );
  }
  return;
}

Assistant:

void ValidateTextureDesc(const TextureDesc& Desc, const IRenderDevice* pDevice) noexcept(false)
{
    const TextureFormatAttribs& FmtAttribs  = GetTextureFormatAttribs(Desc.Format);
    const GraphicsAdapterInfo&  AdapterInfo = pDevice->GetAdapterInfo();
    const RenderDeviceInfo&     DeviceInfo  = pDevice->GetDeviceInfo();

    if (Desc.Type == RESOURCE_DIM_UNDEFINED)
    {
        LOG_TEXTURE_ERROR_AND_THROW("Resource dimension is undefined.");
    }

    if (!(Desc.Type >= RESOURCE_DIM_TEX_1D && Desc.Type <= RESOURCE_DIM_TEX_CUBE_ARRAY))
    {
        LOG_TEXTURE_ERROR_AND_THROW("Unexpected resource dimension.");
    }

    if (Desc.Width == 0)
    {
        LOG_TEXTURE_ERROR_AND_THROW("Texture width cannot be zero.");
    }

    // Perform some parameter correctness check
    if (Desc.Type == RESOURCE_DIM_TEX_1D || Desc.Type == RESOURCE_DIM_TEX_1D_ARRAY)
    {
        if (Desc.Height != FmtAttribs.BlockHeight)
        {
            if (FmtAttribs.BlockHeight == 1)
            {
                LOG_TEXTURE_ERROR_AND_THROW("Height (", Desc.Height, ") of a Texture 1D/Texture 1D Array must be 1.");
            }
            else
            {
                LOG_TEXTURE_ERROR_AND_THROW("For block-compressed formats, the height (", Desc.Height,
                                            ") of a Texture 1D/Texture 1D Array must be equal to the compressed block height (",
                                            Uint32{FmtAttribs.BlockHeight}, ").");
            }
        }
    }
    else
    {
        if (Desc.Height == 0)
            LOG_TEXTURE_ERROR_AND_THROW("Texture height cannot be zero.");
    }

    if (Desc.Type == RESOURCE_DIM_TEX_3D && Desc.Depth == 0)
    {
        LOG_TEXTURE_ERROR_AND_THROW("3D texture depth cannot be zero.");
    }

    if (Desc.Type == RESOURCE_DIM_TEX_1D || Desc.Type == RESOURCE_DIM_TEX_2D)
    {
        if (Desc.ArraySize != 1)
            LOG_TEXTURE_ERROR_AND_THROW("Texture 1D/2D must have one array slice (", Desc.ArraySize, " provided). Use Texture 1D/2D array if you need more than one slice.");
    }

    if (Desc.Type == RESOURCE_DIM_TEX_CUBE || Desc.Type == RESOURCE_DIM_TEX_CUBE_ARRAY)
    {
        if (Desc.Width != Desc.Height)
            LOG_TEXTURE_ERROR_AND_THROW("For cube map textures, texture width (", Desc.Width, " provided) must match texture height (", Desc.Height, " provided).");

        if (Desc.ArraySize < 6)
            LOG_TEXTURE_ERROR_AND_THROW("Texture cube/cube array must have at least 6 slices (", Desc.ArraySize, " provided).");
    }

#ifdef DILIGENT_DEVELOPMENT
    {
        Uint32 MaxDim = 0;
        if (Desc.Is1D())
            MaxDim = Desc.Width;
        else if (Desc.Is2D())
            MaxDim = std::max(Desc.Width, Desc.Height);
        else if (Desc.Is3D())
            MaxDim = std::max(std::max(Desc.Width, Desc.Height), Desc.Depth);
        DEV_CHECK_ERR(MaxDim >= (1U << (Desc.MipLevels - 1)), "Texture '", Desc.Name ? Desc.Name : "", "': Incorrect number of Mip levels (", Desc.MipLevels, ").");
    }
#endif

    if (Desc.SampleCount > 1)
    {
        VERIFY_TEXTURE(IsPowerOfTwo(Desc.SampleCount), "SampleCount must be a power-of-two value");

        if (!(Desc.Type == RESOURCE_DIM_TEX_2D || Desc.Type == RESOURCE_DIM_TEX_2D_ARRAY))
            LOG_TEXTURE_ERROR_AND_THROW("Only Texture 2D/Texture 2D Array can be multisampled");

        if (Desc.MipLevels != 1)
            LOG_TEXTURE_ERROR_AND_THROW("Multisampled textures must have one mip level (", Desc.MipLevels, " levels specified).");

        if (Desc.BindFlags & BIND_UNORDERED_ACCESS)
            LOG_TEXTURE_ERROR_AND_THROW("UAVs are not allowed for multisampled resources");
    }

    if ((Desc.BindFlags & BIND_RENDER_TARGET) &&
        (Desc.Format == TEX_FORMAT_R8_SNORM || Desc.Format == TEX_FORMAT_RG8_SNORM || Desc.Format == TEX_FORMAT_RGBA8_SNORM ||
         Desc.Format == TEX_FORMAT_R16_SNORM || Desc.Format == TEX_FORMAT_RG16_SNORM || Desc.Format == TEX_FORMAT_RGBA16_SNORM))
    {
        const char* FmtName = GetTextureFormatAttribs(Desc.Format).Name;
        LOG_WARNING_MESSAGE(FmtName, " texture is created with BIND_RENDER_TARGET flag set.\n"
                                     "There might be an issue in OpenGL driver on NVidia hardware: when rendering to SNORM textures, all negative values are clamped to zero.\n"
                                     "Use UNORM format instead.");
    }

    if (Desc.MiscFlags & MISC_TEXTURE_FLAG_MEMORYLESS)
    {
        const AdapterMemoryInfo& MemInfo = AdapterInfo.Memory;

        if (MemInfo.MemorylessTextureBindFlags == BIND_NONE)
            LOG_TEXTURE_ERROR_AND_THROW("Memoryless textures are not supported by device");

        if ((Desc.BindFlags & MemInfo.MemorylessTextureBindFlags) != Desc.BindFlags)
            LOG_TEXTURE_ERROR_AND_THROW("BindFlags ", GetBindFlagsString(Desc.BindFlags & ~MemInfo.MemorylessTextureBindFlags), " are not supported for memoryless textures.");

        if (Desc.Usage != USAGE_DEFAULT)
            LOG_TEXTURE_ERROR_AND_THROW("Memoryless attachment requires USAGE_DEFAULT.");

        if (Desc.CPUAccessFlags != 0)
            LOG_TEXTURE_ERROR_AND_THROW("Memoryless attachment requires CPUAccessFlags to be NONE.");

        if (Desc.MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS)
            LOG_TEXTURE_ERROR_AND_THROW("Memoryless attachment is not compatible with mipmap generation.");
    }

    if (Desc.Usage == USAGE_STAGING)
    {
        if (Desc.BindFlags != 0)
            LOG_TEXTURE_ERROR_AND_THROW("Staging textures cannot be bound to any GPU pipeline stage.");

        if (Desc.MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS)
            LOG_TEXTURE_ERROR_AND_THROW("Mipmaps cannot be autogenerated for staging textures.");

        if (Desc.CPUAccessFlags == 0)
            LOG_TEXTURE_ERROR_AND_THROW("Staging textures must specify CPU access flags.");

        if ((Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == (CPU_ACCESS_READ | CPU_ACCESS_WRITE))
            LOG_TEXTURE_ERROR_AND_THROW("Staging textures must use exactly one of ACCESS_READ or ACCESS_WRITE flags.");
    }
    else if (Desc.Usage == USAGE_UNIFIED)
    {
        LOG_TEXTURE_ERROR_AND_THROW("USAGE_UNIFIED textures are currently not supported.");
    }

    if (Desc.Usage == USAGE_DYNAMIC &&
        PlatformMisc::CountOneBits(Desc.ImmediateContextMask) > 1)
    {
        // Dynamic textures always use backing resource that requires implicit state transitions
        // in map/unmap operations, which is not safe in multiple contexts.
        LOG_TEXTURE_ERROR_AND_THROW("USAGE_DYNAMIC textures may only be used in one immediate device context.");
    }

    const ShadingRateProperties& SRProps = pDevice->GetAdapterInfo().ShadingRate;
    if (Desc.MiscFlags & MISC_TEXTURE_FLAG_SUBSAMPLED)
    {
        if (!pDevice->GetDeviceInfo().Features.VariableRateShading)
            LOG_TEXTURE_ERROR_AND_THROW("MISC_TEXTURE_FLAG_SUBSAMPLED requires VariableRateShading feature.");

        if (pDevice->GetDeviceInfo().IsMetalDevice())
            LOG_TEXTURE_ERROR_AND_THROW("MISC_TEXTURE_FLAG_SUBSAMPLED is not supported in Metal, use IRasterizationRateMapMtl to implement VRS in Metal");

        if ((SRProps.CapFlags & SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET) == 0)
            LOG_TEXTURE_ERROR_AND_THROW("MISC_TEXTURE_FLAG_SUBSAMPLED requires SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET capability.");

        if ((Desc.BindFlags & (BIND_RENDER_TARGET | BIND_DEPTH_STENCIL)) == 0)
            LOG_TEXTURE_ERROR_AND_THROW("Subsampled texture must use one of BIND_RENDER_TARGET or BIND_DEPTH_STENCIL bind flags");

        if (Desc.BindFlags & BIND_SHADING_RATE)
            LOG_TEXTURE_ERROR_AND_THROW("MISC_TEXTURE_FLAG_SUBSAMPLED is not compatible with BIND_SHADING_RATE");
    }

    if (Desc.BindFlags & BIND_SHADING_RATE)
    {
        if (!pDevice->GetDeviceInfo().Features.VariableRateShading)
            LOG_TEXTURE_ERROR_AND_THROW("BIND_SHADING_RATE requires VariableRateShading feature.");

        if (pDevice->GetDeviceInfo().IsMetalDevice())
            LOG_TEXTURE_ERROR_AND_THROW("BIND_SHADING_RATE is not supported in Metal, use IRasterizationRateMapMtl instead.");

        if (DeviceInfo.IsMetalDevice())
            LOG_TEXTURE_ERROR_AND_THROW("BIND_FLAG_SHADING_RATE is not supported in Metal, use IRasterizationRateMapMtl instead.");

        if ((SRProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED) == 0)
            LOG_TEXTURE_ERROR_AND_THROW("BIND_SHADING_RATE requires SHADING_RATE_CAP_FLAG_TEXTURE_BASED capability.");

        if (Desc.SampleCount != 1)
            LOG_TEXTURE_ERROR_AND_THROW("BIND_SHADING_RATE is not allowed for multisample texture.");

        if (Desc.Type == RESOURCE_DIM_TEX_2D_ARRAY && Desc.ArraySize > 1 && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY) == 0)
            LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture arrays require SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability");

        if (Desc.Usage != USAGE_DEFAULT && Desc.Usage != USAGE_IMMUTABLE)
            LOG_TEXTURE_ERROR_AND_THROW("Shading rate textures only allow USAGE_DEFAULT or USAGE_IMMUTABLE.");

        // For Direct3D12 and Vulkan with VK_EXT_fragment_density_map
        if (Desc.MipLevels != 1)
            LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture must have 1 mip level.");

        if ((Desc.BindFlags & ~SRProps.BindFlags) != 0)
            LOG_TEXTURE_ERROR_AND_THROW("the following bind flags are not allowed for a shading rate texture: ", GetBindFlagsString(Desc.BindFlags & ~SRProps.BindFlags, ", "), '.');

        // TODO: Vulkan allows to create 2D texture array and then use single slice for view even if SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability is not supported
        if (Desc.Type != RESOURCE_DIM_TEX_2D && !(Desc.Type == RESOURCE_DIM_TEX_2D_ARRAY && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY) != 0))
            LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture must be 2D or 2D Array with SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability.");

        switch (SRProps.Format)
        {
            case SHADING_RATE_FORMAT_PALETTE:
                if (Desc.Format != TEX_FORMAT_R8_UINT)
                    LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture format must be R8_UINT.");
                break;

            case SHADING_RATE_FORMAT_UNORM8:
                if (Desc.Format != TEX_FORMAT_RG8_UNORM)
                    LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture format must be RG8_UNORM.");
                break;

            case SHADING_RATE_FORMAT_COL_ROW_FP32:
            default:
                LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture is not supported.");
        }
    }

    if (Desc.Usage == USAGE_SPARSE)
    {
        VERIFY_TEXTURE(DeviceInfo.Features.SparseResources, "sparse texture requires SparseResources feature");

        const SparseResourceProperties& SparseRes = AdapterInfo.SparseResources;

        if ((Desc.MiscFlags & MISC_TEXTURE_FLAG_SPARSE_ALIASING) != 0)
            VERIFY_TEXTURE((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_ALIASED) != 0, "MISC_TEXTURE_FLAG_SPARSE_ALIASING flag requires SPARSE_RESOURCE_CAP_FLAG_ALIASED capability");

        static_assert(RESOURCE_DIM_NUM_DIMENSIONS == 9, "Please update the switch below to handle the new resource dimension type");
        switch (Desc.Type)
        {
            case RESOURCE_DIM_TEX_2D:
                VERIFY_TEXTURE((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) != 0,
                               "2D texture requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability");
                break;

            case RESOURCE_DIM_TEX_2D_ARRAY:
            case RESOURCE_DIM_TEX_CUBE:
            case RESOURCE_DIM_TEX_CUBE_ARRAY:
                VERIFY_TEXTURE((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) != 0,
                               "2D array or Cube sparse textures requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability");

                if ((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL) == 0)
                {
                    const SparseTextureProperties Props = GetStandardSparseTextureProperties(Desc);
                    const uint2                   MipSize{std::max(1u, Desc.Width >> Desc.MipLevels),
                                        std::max(1u, Desc.Height >> Desc.MipLevels)};
                    VERIFY_TEXTURE(MipSize.x >= Props.TileSize[0] && MipSize.y >= Props.TileSize[1],
                                   "2D array or Cube sparse texture with mip level count ", Desc.MipLevels,
                                   ", where the last mip with dimension (", MipSize.x, "x", MipSize.y, ") is less than the tile size (",
                                   Props.TileSize[0], "x", Props.TileSize[1], ") requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL capability");
                }
                break;

            case RESOURCE_DIM_TEX_3D:
                VERIFY_TEXTURE((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D) != 0,
                               "3D sparse texture requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D capability");
                break;

            case RESOURCE_DIM_TEX_1D:
            case RESOURCE_DIM_TEX_1D_ARRAY:
                LOG_TEXTURE_ERROR_AND_THROW("Sparse 1D textures are not supported");
                break;

            default:
                LOG_TEXTURE_ERROR_AND_THROW("unknown texture type");
        }
    }
    else
    {
        VERIFY_TEXTURE((Desc.MiscFlags & MISC_TEXTURE_FLAG_SPARSE_ALIASING) == 0,
                       "MiscFlags must not have MISC_TEXTURE_FLAG_SPARSE_ALIASING if usage is not USAGE_SPARSE");
    }
}